

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::smokeTest(DecimalMatcher *this,StringSegment *segment)

{
  long lVar1;
  bool bVar2;
  UBool UVar3;
  bool bVar4;
  UChar32 c;
  long lVar5;
  
  if (((this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr ==
       (UnicodeString *)0x0) && (this->leadSet != (UnicodeSet *)0x0)) {
    bVar4 = StringSegment::startsWith(segment,this->leadSet);
    return bVar4;
  }
  bVar2 = StringSegment::startsWith(segment,this->separatorSet);
  bVar4 = true;
  if (!bVar2) {
    c = StringSegment::getCodePoint(segment);
    UVar3 = u_isdigit_63(c);
    if (UVar3 == '\0') {
      if ((this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr ==
          (UnicodeString *)0x0) {
        bVar4 = false;
      }
      else {
        lVar5 = 0;
        do {
          lVar1 = lVar5 + 0x40;
          bVar4 = lVar1 != 0x2c0;
          if (lVar1 == 0x2c0) {
            return bVar4;
          }
          bVar2 = StringSegment::startsWith
                            (segment,(UnicodeString *)
                                     ((long)&(((this->fLocalDigitStrings).
                                               super_LocalPointerBase<const_icu_63::UnicodeString>.
                                              ptr)->super_Replaceable).super_UObject._vptr_UObject +
                                     lVar5));
          lVar5 = lVar1;
        } while (!bVar2);
      }
    }
  }
  return bVar4;
}

Assistant:

bool DecimalMatcher::smokeTest(const StringSegment& segment) const {
    // The common case uses a static leadSet for efficiency.
    if (fLocalDigitStrings.isNull() && leadSet != nullptr) {
        return segment.startsWith(*leadSet);
    }
    if (segment.startsWith(*separatorSet) || u_isdigit(segment.getCodePoint())) {
        return true;
    }
    if (fLocalDigitStrings.isNull()) {
        return false;
    }
    for (int32_t i = 0; i < 10; i++) {
        if (segment.startsWith(fLocalDigitStrings[i])) {
            return true;
        }
    }
    return false;
}